

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeFolding.cpp
# Opt level: O0

void __thiscall wasm::CodeFolding::doWalkFunction(CodeFolding *this,Function *func)

{
  Function *func_00;
  Module *module;
  ReFinalize local_158;
  Function *local_18;
  Function *func_local;
  CodeFolding *this_local;
  
  this->anotherPass = true;
  local_18 = func;
  func_local = (Function *)this;
  while ((this->anotherPass & 1U) != 0) {
    this->anotherPass = false;
    Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>::doWalkFunction
              ((Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_> *)
               &(this->
                super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
                ).
                super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>,
               local_18);
    optimizeTerminatingTails(this,&this->unreachableTails,0);
    optimizeTerminatingTails(this,&this->returnTails,0);
    std::
    map<wasm::Name,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>_>_>
    ::clear(&this->breakTails);
    std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::clear
              (&this->unreachableTails);
    std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::clear
              (&this->returnTails);
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::clear
              (&this->unoptimizables);
    std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
    ::clear(&this->modifieds);
    if ((this->anotherPass & 1U) != 0) {
      ReFinalize::ReFinalize(&local_158);
      func_00 = local_18;
      module = Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>::getModule
                         ((Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_> *)
                          &(this->
                           super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
                           ).
                           super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
                         );
      Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::
      walkFunctionInModule
                (&local_158.
                  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                  .
                  super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                  .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
                 func_00,module);
      ReFinalize::~ReFinalize(&local_158);
    }
  }
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    anotherPass = true;
    while (anotherPass) {
      anotherPass = false;
      super::doWalkFunction(func);
      optimizeTerminatingTails(unreachableTails);
      // optimize returns at the end, so we can benefit from a fallthrough if
      // there is a value TODO: separate passes for them?
      optimizeTerminatingTails(returnTails);
      // TODO add fallthrough for returns
      // TODO optimize returns not in blocks, a big return value can be worth it
      // clean up
      breakTails.clear();
      unreachableTails.clear();
      returnTails.clear();
      unoptimizables.clear();
      modifieds.clear();
      // if we did any work, types may need to be propagated
      if (anotherPass) {
        ReFinalize().walkFunctionInModule(func, getModule());
      }
    }
  }